

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_buffer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  parseArgs(argc,argv);
  glfwInit();
  glfwWindowHint(0x20004,0);
  window = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(window);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 == 0) {
      argv_local._4_4_ = 1;
    }
    else {
      if (mapMethod == MAP_BUFFER_ARB) {
        testMapBufferARB();
      }
      else if (mapMethod == MAP_BUFFER_1_5) {
        testMapBuffer();
      }
      else if (mapMethod == MAP_BUFFER_RANGE) {
        testMapBufferRange();
      }
      glfwDestroyWindow(window);
      glfwTerminate();
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    parseArgs(argc, argv);

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
#ifdef __APPLE__
    if (mapMethod == MAP_BUFFER_RANGE) {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
        glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    }
#endif

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress)) {
        return EXIT_FAILURE;
    }

    switch (mapMethod) {
    case MAP_BUFFER_ARB:
        testMapBufferARB();
        break;
    case MAP_BUFFER_1_5:
        testMapBuffer();
        break;
    case MAP_BUFFER_RANGE:
        testMapBufferRange();
        break;
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}